

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::GLSLangUtils::HLSLtoSPIRV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ShaderCreateInfo *ShaderCI,SpirvVersion Version,char *ExtraDefinitions,
          IDataBlob **ppCompilerOutput)

{
  bool bVar1;
  SHADER_COMPILE_FLAGS SVar2;
  spv_target_env TargetEnv;
  SPIRV_OPTIMIZATION_FLAGS Passes;
  Char *pCVar3;
  char *s;
  char (*Args_1) [55];
  __node_base_ptr local_288;
  undefined1 local_260 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> LegalizedSPIRV;
  undefined1 local_240 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> SPIRV;
  IncluderImpl Includer;
  char *Names [1];
  IDataBlob *pIStack_198;
  int ShaderStringLengths [1];
  char *ShaderStrings [1];
  string Preamble;
  ShaderSourceFileData SourceData;
  string msg_2;
  string msg_1;
  string msg;
  EProfile local_e8;
  EShMessages local_e4;
  EProfile shProfile;
  EShMessages messages;
  TShader Shader;
  EShLanguage ShLang;
  IDataBlob **ppCompilerOutput_local;
  char *ExtraDefinitions_local;
  SpirvVersion Version_local;
  ShaderCreateInfo *ShaderCI_local;
  
  Shader._164_4_ = anon_unknown_4::ShaderTypeToShLanguage((ShaderCI->Desc).ShaderType);
  glslang::TShader::TShader((TShader *)&shProfile,Shader._164_4_);
  local_e4 = EShMsgHlslLegalization|EShMsgReadHlsl|EShMsgVulkanRules|EShMsgSpvRules;
  local_e8 = ENoProfile;
  Args_1 = (char (*) [55])(ulong)Version;
  anon_unknown_4::SetupWithSpirvVersion
            ((TShader *)&shProfile,&local_e8,Shader._164_4_,Version,EShSourceHlsl);
  if (ShaderCI->SourceLanguage != SHADER_SOURCE_LANGUAGE_HLSL) {
    FormatString<char[26],char[55]>
              ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL",Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"HLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1b9);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  if (((((Shader._164_4_ == 6) || (Shader._164_4_ == 7)) || (Shader._164_4_ == 8)) ||
      ((Shader._164_4_ == 9 || (Shader._164_4_ == 10)))) || (Shader._164_4_ == 0xb)) {
    FormatString<char[79]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [79])
               "Ray tracing shaders are not supported, use DXCompiler to build SPIRV from HLSL");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"HLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1bc);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((Shader._164_4_ == 0xc) || (Shader._164_4_ == 0xd)) {
    FormatString<char[72]>
              ((string *)&SourceData.SourceLength,
               (char (*) [72])
               "Mesh shaders are not supported, use DXCompiler to build SPIRV from HLSL");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"HLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1be);
    std::__cxx11::string::~string((string *)&SourceData.SourceLength);
  }
  glslang::TShader::setHlslIoMapping((TShader *)&shProfile,true);
  glslang::TShader::setEntryPoint((TShader *)&shProfile,ShaderCI->EntryPoint);
  glslang::TShader::setEnvTargetHlslFunctionality1((TShader *)&shProfile);
  ReadShaderSourceFile((ShaderSourceFileData *)((long)&Preamble.field_2 + 8),ShaderCI);
  std::__cxx11::string::string((string *)ShaderStrings);
  SVar2 = Diligent::operator&(ShaderCI->CompileFlags,SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR);
  if (SVar2 != SHADER_COMPILE_FLAG_NONE) {
    std::__cxx11::string::operator+=((string *)ShaderStrings,"#pragma pack_matrix(row_major)\n\n");
  }
  std::__cxx11::string::append((char *)ShaderStrings);
  std::__cxx11::string::append((char *)ShaderStrings);
  AppendShaderTypeDefinitions((string *)ShaderStrings,(ShaderCI->Desc).ShaderType);
  if (ExtraDefinitions != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)ShaderStrings,ExtraDefinitions);
  }
  bVar1 = ShaderMacroArray::operator_cast_to_bool(&ShaderCI->Macros);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)ShaderStrings,'\n');
    AppendShaderMacros((string *)ShaderStrings,&ShaderCI->Macros);
  }
  s = (char *)std::__cxx11::string::c_str();
  glslang::TShader::setPreamble((TShader *)&shProfile,s);
  pIStack_198 = SourceData.pFileData.m_pObject;
  Names[0]._4_4_ = (uint)SourceData.Source;
  if (ShaderCI->FilePath == (Char *)0x0) {
    local_288 = (__node_base_ptr)0xc361e0;
  }
  else {
    local_288 = (__node_base_ptr)ShaderCI->FilePath;
  }
  Includer.m_DataBlobs._M_h._M_single_bucket = local_288;
  glslang::TShader::setStringsWithLengthsAndNames
            ((TShader *)&shProfile,(char **)&stack0xfffffffffffffe68,(int *)((long)Names + 4),
             (char **)&Includer.m_DataBlobs._M_h._M_single_bucket,1);
  glslang::TShader::setDxPositionW((TShader *)&shProfile,true);
  anon_unknown_4::IncluderImpl::IncluderImpl
            ((IncluderImpl *)
             &SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,ShaderCI->pShaderSourceStreamFactory);
  anon_unknown_4::CompileShaderInternal
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_240,(TShader *)&shProfile,
             local_e4,(Includer *)
                      &SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,
             (char *)SourceData.pFileData.m_pObject,(ulong)(uint)SourceData.Source,true,local_e8,
             ppCompilerOutput);
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_240);
  if (bVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_240);
    LegalizedSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    TargetEnv = anon_unknown_4::SpirvVersionToSpvTargetEnv(Version);
    Passes = Diligent::operator|(SPIRV_OPTIMIZATION_FLAG_LEGALIZATION,
                                 SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_240,TargetEnv,Passes)
    ;
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260);
    if (bVar1) {
      LogError<false,char[101]>
                (false,"HLSLtoSPIRV",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
                 ,0x1f1,(char (*) [101])
                        "Failed to legalize SPIR-V shader generated by HLSL front-end. This may result in undefined behavior."
                );
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_240);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260);
    }
    LegalizedSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_260);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_240);
  anon_unknown_4::IncluderImpl::~IncluderImpl
            ((IncluderImpl *)
             &SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)ShaderStrings);
  ShaderSourceFileData::~ShaderSourceFileData((ShaderSourceFileData *)((long)&Preamble.field_2 + 8))
  ;
  glslang::TShader::~TShader((TShader *)&shProfile);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> HLSLtoSPIRV(const ShaderCreateInfo& ShaderCI,
                                      SpirvVersion            Version,
                                      const char*             ExtraDefinitions,
                                      IDataBlob**             ppCompilerOutput)
{
    EShLanguage        ShLang = ShaderTypeToShLanguage(ShaderCI.Desc.ShaderType);
    ::glslang::TShader Shader{ShLang};
    EShMessages        messages  = (EShMessages)(EShMsgSpvRules | EShMsgVulkanRules | EShMsgReadHlsl | EShMsgHlslLegalization);
    ::EProfile         shProfile = EProfile::ENoProfile;

    SetupWithSpirvVersion(Shader, shProfile, ShLang, Version, ::glslang::EShSourceHlsl);

    VERIFY_EXPR(ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL);

    VERIFY(ShLang != EShLangRayGen && ShLang != EShLangIntersect && ShLang != EShLangAnyHit && ShLang != EShLangClosestHit && ShLang != EShLangMiss && ShLang != EShLangCallable,
           "Ray tracing shaders are not supported, use DXCompiler to build SPIRV from HLSL");
    VERIFY(ShLang != EShLangTaskNV && ShLang != EShLangMeshNV,
           "Mesh shaders are not supported, use DXCompiler to build SPIRV from HLSL");

    Shader.setHlslIoMapping(true);
    Shader.setEntryPoint(ShaderCI.EntryPoint);
    Shader.setEnvTargetHlslFunctionality1();

    const auto SourceData = ReadShaderSourceFile(ShaderCI);

    std::string Preamble;
    if ((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) != 0)
        Preamble += "#pragma pack_matrix(row_major)\n\n";
    Preamble.append("#define GLSLANG\n\n");
    Preamble.append(g_HLSLDefinitions);
    AppendShaderTypeDefinitions(Preamble, ShaderCI.Desc.ShaderType);

    if (ExtraDefinitions != nullptr)
        Preamble += ExtraDefinitions;

    if (ShaderCI.Macros)
    {
        Preamble += '\n';
        AppendShaderMacros(Preamble, ShaderCI.Macros);
    }

    Shader.setPreamble(Preamble.c_str());

    const char* ShaderStrings[]       = {SourceData.Source};
    const int   ShaderStringLengths[] = {static_cast<int>(SourceData.SourceLength)};
    const char* Names[]               = {ShaderCI.FilePath != nullptr ? ShaderCI.FilePath : ""};
    Shader.setStringsWithLengthsAndNames(ShaderStrings, ShaderStringLengths, Names, 1);

    // By default, PSInput.SV_Position.w == 1 / VSOutput.SV_Position.w.
    // Make the behavior consistent with DX:
    Shader.setDxPositionW(true);

    IncluderImpl Includer{ShaderCI.pShaderSourceStreamFactory};

    auto SPIRV = CompileShaderInternal(Shader, messages, &Includer, SourceData.Source, SourceData.SourceLength, true, shProfile, ppCompilerOutput);
    if (SPIRV.empty())
        return SPIRV;

#ifdef USE_SPIRV_TOOLS
    // SPIR-V bytecode generated from HLSL must be legalized to
    // turn it into a valid vulkan SPIR-V shader.
    auto LegalizedSPIRV = OptimizeSPIRV(SPIRV, SpirvVersionToSpvTargetEnv(Version), SPIRV_OPTIMIZATION_FLAG_LEGALIZATION | SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    if (!LegalizedSPIRV.empty())
    {
        return LegalizedSPIRV;
    }
    else
    {
        LOG_ERROR("Failed to legalize SPIR-V shader generated by HLSL front-end. This may result in undefined behavior.");
    }
#endif
    return SPIRV;
}